

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

oonf_layer2_neighbor_address * oonf_layer2_net_get_best_neighbor_match(netaddr *addr)

{
  list_entity *plVar1;
  list_entity *plVar2;
  ulong uVar3;
  list_entity *__tempptr_8;
  list_entity *__tempptr_7;
  list_entity *__tempptr_6;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  list_entity *plStack_40;
  int prefix_length;
  oonf_layer2_net *l2net;
  oonf_layer2_neigh *l2neigh;
  oonf_layer2_neighbor_address *l2addr;
  oonf_layer2_neighbor_address *best_match;
  netaddr *addr_local;
  
  __tempptr._4_4_ = 0x100;
  l2addr = (oonf_layer2_neighbor_address *)0x0;
  for (plStack_40 = _oonf_layer2_net_tree.list_head.next + -0x7a;
      plStack_40[0x7a].prev != _oonf_layer2_net_tree.list_head.prev;
      plStack_40 = plStack_40[0x7a].next + -0x7a) {
    for (plVar1 = plStack_40[9].next; plVar1->prev != plStack_40[9].prev; plVar1 = plVar1->next) {
      for (plVar2 = plVar1[-0x44].next; l2neigh = (oonf_layer2_neigh *)(plVar2 + -6),
          plVar2->prev != plVar1[-0x44].prev; plVar2 = plVar2->next) {
        uVar3 = netaddr_is_in_subnet(l2neigh,addr);
        if (((uVar3 & 1) != 0) && (*(byte *)((long)&plVar2[-5].next + 1) < __tempptr._4_4_)) {
          l2addr = (oonf_layer2_neighbor_address *)l2neigh;
          __tempptr._4_4_ = (uint)*(byte *)((long)&plVar2[-5].next + 1);
        }
      }
    }
  }
  return l2addr;
}

Assistant:

struct oonf_layer2_neighbor_address *
oonf_layer2_net_get_best_neighbor_match(const struct netaddr *addr) {
  struct oonf_layer2_neighbor_address *best_match, *l2addr;
  struct oonf_layer2_neigh *l2neigh;
  struct oonf_layer2_net *l2net;
  int prefix_length;

  prefix_length = 256;
  best_match = NULL;

  avl_for_each_element(&_oonf_layer2_net_tree, l2net, _node) {
    avl_for_each_element(&l2net->neighbors, l2neigh, _node) {
      avl_for_each_element(&l2neigh->remote_neighbor_ips, l2addr, _neigh_node) {
        if (netaddr_is_in_subnet(&l2addr->ip, addr) && netaddr_get_prefix_length(&l2addr->ip) < prefix_length) {
          best_match = l2addr;
          prefix_length = netaddr_get_prefix_length(&l2addr->ip);
        }
      }
    }
  }
  return best_match;
}